

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O3

void Js::ByteCodeDumper::DumpOp
               (OpCode op,LayoutSize layoutSize,ByteCodeReader *reader,FunctionBody *dumpFunction)

{
  code *pcVar1;
  bool bVar2;
  OpLayoutType OVar3;
  uint uVar4;
  OpLayoutEmpty *data;
  OpLayoutReg3U_Small *data_00;
  OpLayoutReg3_Small *data_01;
  OpLayoutReg2_Small *pOVar5;
  OpLayoutBrLong *pOVar6;
  OpLayoutCallIWithICIndex_Small *data_02;
  OpLayoutProfiledCallIFlagsWithICIndex_Small *data_03;
  OpLayoutCallIFlagsWithICIndex_Small *data_04;
  OpLayoutReg4U_Small *data_05;
  OpLayoutElementP_Small *data_06;
  OpLayoutCallIExtendedFlagsWithICIndex_Small *data_07;
  OpLayoutBrReg2_Small *data_08;
  OpLayoutProfiledElementSlotI2_Small *data_09;
  OpLayoutElementC2_Small *data_10;
  OpLayoutReg4_Medium *data_11;
  OpLayoutReg3C_Small *data_12;
  OpLayoutBrLocalProperty *data_13;
  OpLayoutBrReg2_Medium *data_14;
  OpLayoutProfiledCallIExtendedFlags_Small *data_15;
  OpLayoutProfiledCallI_Small *data_16;
  OpLayoutReg1_Small *pOVar7;
  OpLayoutProfiledElementSlotI3_Small *data_17;
  OpLayoutReg4U_Medium *data_18;
  OpLayoutBrS *data_19;
  OpLayoutProfiledElementCP_Medium *data_20;
  OpLayoutElementC_Small *data_21;
  OpLayoutBrReg1Unsigned1_Medium *data_22;
  OpLayoutElementP_Medium *data_23;
  OpLayoutProfiledCallIExtendedFlagsWithICIndex_Medium *data_24;
  OpLayoutProfiled2CallI_Medium *data_25;
  OpLayoutProfiledArg_Small *data_26;
  OpLayoutElementSlotI2_Small *data_27;
  OpLayoutElementScopedC2_Medium *data_28;
  OpLayoutReg1Unsigned1_Medium *data_29;
  OpLayoutReg5_Small *data_30;
  OpLayoutCallIExtendedFlags_Medium *data_31;
  OpLayoutCallIFlags_Medium *data_32;
  OpLayoutBrEnvProperty *data_33;
  OpLayoutElementU_Medium *data_34;
  OpLayoutElementScopedC_Small *data_35;
  OpLayoutProfiledElementSlot_Medium *data_36;
  OpLayoutProfiledCallIExtendedWithICIndex_Medium *data_37;
  OpLayoutAuxiliary *playout;
  OpLayoutProfiledCallIExtendedWithICIndex_Small *data_38;
  OpLayoutReg3C_Large *data_39;
  OpLayoutElementSlotI3_Small *data_40;
  OpLayoutElementUnsigned1_Medium *data_41;
  OpLayoutReg2Aux *playout_00;
  OpLayoutCallI_Large *data_42;
  OpLayoutProfiledCallIWithICIndex_Medium *data_43;
  OpLayoutArg_Medium *data_44;
  OpLayoutCallIExtendedFlags_Small *data_45;
  OpLayoutCallI_Medium *data_46;
  OpLayoutProfiledArg_Medium *data_47;
  OpLayoutReg5_Medium *data_48;
  OpLayoutElementU_Small *data_49;
  OpLayoutElementC2_Medium *data_50;
  OpLayoutProfiledElementSlotI3_Medium *data_51;
  OpLayoutProfiledCallIWithICIndex_Large *data_52;
  OpLayoutReg2U_Large *data_53;
  OpLayoutProfiledCallI_Medium *data_54;
  OpLayoutArgNoSrc_Large *data_55;
  OpLayoutReg5U_Large *data_56;
  OpLayoutProfiledReg1Unsigned1_Small *data_57;
  OpLayoutProfiledElementSlotI1_Medium *data_58;
  OpLayoutProfiledCallIFlagsWithICIndex_Large *data_59;
  OpLayoutReg2Int1_Small *data_60;
  OpLayoutCallIFlagsWithICIndex_Large *data_61;
  OpLayoutElementScopedU_Medium *data_62;
  OpLayoutCallIExtendedFlagsWithICIndex_Large *data_63;
  OpLayoutCallIExtended_Large *data_64;
  OpLayoutAuxNoReg *playout_01;
  OpLayoutElementRootCP_Large *data_65;
  OpLayoutReg2U_Small *data_66;
  OpLayoutReg2Int1_Medium *data_67;
  OpLayoutBrReg1Unsigned1_Large *data_68;
  OpLayoutElementScopedC2_Large *data_69;
  OpLayoutProfiledCallIExtended_Large *data_70;
  OpLayoutProfiledArg_Large *data_71;
  OpLayoutReg2B1_Medium *data_72;
  OpLayoutReg4_Large *data_73;
  OpLayoutReg1_Medium *pOVar8;
  OpLayoutElementPIndexed_Medium *data_74;
  OpLayoutElementSlotI1_Large *data_75;
  OpLayoutReg5U_Medium *data_76;
  OpLayoutElementRootCP_Small *data_77;
  OpLayoutElementRootCP_Medium *data_78;
  OpLayoutArg_Large *data_79;
  OpLayoutElementScopedU_Large *data_80;
  OpLayoutCallIFlags_Large *data_81;
  OpLayoutProfiledReg2_Medium *data_82;
  OpLayoutProfiledReg3_Large *data_83;
  OpLayoutReg1_Large *pOVar9;
  OpLayoutProfiledElementSlot_Large *data_84;
  OpLayoutProfiledCallIExtendedFlagsWithICIndex_Small *data_85;
  OpLayoutElementSlotI2_Large *data_86;
  OpLayoutElementI_Large *data_87;
  OpLayoutProfiledElementI_Large *data_88;
  OpLayoutReg2Int1_Large *data_89;
  OpLayoutElementC2_Large *data_90;
  OpLayoutProfiledReg3_Medium *data_91;
  OpLayoutReg2_Large *pOVar10;
  OpLayoutElementRootU_Large *data_92;
  OpLayoutElementSlotI3_Large *data_93;
  OpLayoutReg5_Large *data_94;
  OpLayoutUnsigned1_Large *pOVar11;
  OpLayoutCallIExtendedFlagsWithICIndex_Medium *data_95;
  OpLayoutProfiledCallIExtended_Medium *data_96;
  OpLayoutCallIExtendedFlags_Large *data_97;
  OpLayoutElementPIndexed_Large *data_98;
  OpLayoutElementRootU_Small *data_99;
  OpLayoutCallIExtended_Small *data_x00100;
  OpLayoutCallIExtendedWithICIndex_Medium *data_x00101;
  OpLayoutCallIExtendedWithICIndex_Small *data_x00102;
  OpLayoutProfiled2CallI_Large *data_x00103;
  OpLayoutElementSlotI1_Medium *data_x00104;
  OpLayoutElementCP_Large *data_x00105;
  OpLayoutReg3_Large *data_x00106;
  OpLayoutElementU_Large *data_x00107;
  OpLayoutUnsigned1_Medium *pOVar12;
  OpLayoutProfiledReg2_Large *data_x00108;
  OpLayoutElementScopedC_Large *data_x00109;
  OpLayoutElementSlot_Large *data_x00110;
  OpLayoutProfiledElementSlotI3_Large *data_x00111;
  OpLayoutElementP_Large *data_x00112;
  OpLayoutProfiledElementSlotI1_Large *data_x00113;
  OpLayoutProfiledElementSlotI2_Large *data_x00114;
  OpLayoutProfiledCallIExtendedFlags_Large *data_x00115;
  OpLayoutProfiled2CallIExtended_Large *data_x00116;
  OpLayoutReg3B1_Small *data_x00117;
  OpLayoutBrReg2_Large *data_x00118;
  OpLayoutReg3_Medium *data_x00119;
  OpLayoutReg2_Medium *pOVar13;
  OpLayoutElementCP_Medium *data_x00120;
  OpLayoutElementC_Large *data_x00121;
  OpLayoutElementScopedC_Medium *data_x00122;
  OpLayoutReg3C_Medium *data_x00123;
  OpLayoutArgNoSrc_Small *data_x00124;
  OpLayoutProfiledReg1Unsigned1_Medium *data_x00125;
  OpLayoutArgNoSrc_Medium *data_x00126;
  OpLayoutProfiledCallIExtended_Small *data_x00127;
  OpLayoutReg2U_Medium *data_x00128;
  OpLayoutProfiledCallIFlags_Large *data_x00129;
  OpLayoutProfiledElementCP_Large *data_x00130;
  OpLayoutReg4U_Large *data_x00131;
  OpLayoutProfiledCallI_Large *data_x00132;
  OpLayoutReg3U_Large *data_x00133;
  OpLayoutElementUnsigned1_Large *data_x00134;
  OpLayoutProfiledCallIExtendedWithICIndex_Large *data_x00135;
  OpLayoutCallIExtendedWithICIndex_Large *data_x00136;
  OpLayoutProfiledCallIFlags_Small *data_x00137;
  OpLayoutReg3B1_Medium *data_x00138;
  OpLayoutCallIWithICIndex_Large *data_x00139;
  OpLayoutReg5U_Small *data_x00140;
  OpLayoutProfiledCallIExtendedFlagsWithICIndex_Large *data_x00141;
  OpLayoutProfiled2CallIExtended_Small *data_x00142;
  OpLayoutProfiledReg1Unsigned1_Large *data_x00143;
  OpLayoutW1 *pOVar14;
  OpLayoutBrReg1_Medium *data_x00144;
  OpLayoutProfiledReg2_Small *data_x00145;
  OpLayoutElementSlotI3_Medium *data_x00146;
  OpLayoutReg2B1_Small *data_x00147;
  OpLayoutReg4_Small *data_x00148;
  OpLayoutReg1Unsigned1_Large *data_x00149;
  OpLayoutElementSlot_Small *data_x00150;
  OpLayoutUnsigned1_Small *pOVar15;
  OpLayoutElementScopedU_Small *data_x00151;
  OpLayoutReg3U_Medium *data_x00152;
  OpLayoutReg2B1_Large *data_x00153;
  OpLayoutBrReg1_Large *data_x00154;
  OpLayoutProfiledElementSlotI2_Medium *data_x00155;
  OpLayoutBrReg1_Small *data_x00156;
  OpLayoutElementC_Medium *data_x00157;
  OpLayoutProfiledAuxiliary *data_x00158;
  OpLayoutElementSlotI2_Medium *data_x00159;
  OpLayoutProfiledCallIFlags_Medium *data_x00160;
  OpLayoutReg3B1_Large *data_x00161;
  OpLayoutCallIWithICIndex_Medium *data_x00162;
  OpLayoutElementSlotI1_Small *data_x00163;
  OpLayoutElementSlot_Medium *data_x00164;
  OpLayoutCallIFlagsWithICIndex_Medium *data_x00165;
  OpLayoutCallIFlags_Small *data_x00166;
  OpLayoutBrProperty *data_x00167;
  OpLayoutElementRootU_Medium *data_x00168;
  OpLayoutProfiledCallIExtendedFlags_Medium *data_x00169;
  OpLayoutProfiledCallIFlagsWithICIndex_Medium *data_x00170;
  OpLayoutProfiledElementCP_Small *data_x00171;
  OpLayoutCallI_Small *data_x00172;
  OpLayoutBr *pOVar16;
  OpLayoutElementI_Medium *data_x00173;
  OpLayoutProfiledElementI_Medium *data_x00174;
  OpLayoutElementCP_Small *data_x00175;
  OpLayoutProfiledReg3_Small *data_x00176;
  OpLayoutArg_Small *data_x00177;
  OpLayoutProfiled2CallIExtended_Medium *data_x00178;
  OpLayoutBrReg1Unsigned1_Small *data_x00179;
  OpLayoutCallIExtended_Medium *data_x00180;
  OpLayoutElementScopedC2_Small *data_x00181;
  OpLayoutProfiledElementSlot_Small *data_x00182;
  OpLayoutElementUnsigned1_Small *data_x00183;
  OpLayoutStartCall *data_x00184;
  OpLayoutElementI_Small *data_x00185;
  OpLayoutProfiledCallIWithICIndex_Small *data_x00186;
  OpLayoutProfiledElementSlotI1_Small *data_x00187;
  OpLayoutProfiledElementI_Small *data_x00188;
  OpLayoutElementPIndexed_Small *data_x00189;
  OpLayoutProfiled2CallI_Small *data_x00190;
  OpLayoutReg1Unsigned1_Small *data_x00191;
  undefined4 *puVar17;
  uint uVar18;
  char *reader_00;
  FunctionBody *dumpFunction_00;
  FunctionBody *dumpFunction_01;
  ulong uVar19;
  char16_t *form;
  
  data = (OpLayoutEmpty *)OpCodeUtil::GetOpCodeName(op);
  Output::Print(L"%-20s");
  OVar3 = OpCodeUtil::GetOpCodeLayout(op);
  uVar18 = layoutSize * 0x4e + OVar3._value;
  if (0xe9 < uVar18) {
switchD_007ea7cd_caseD_4e:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar17 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                ,0x691,"(false)","Unknown OpLayout");
    if (bVar2) {
      *puVar17 = 0;
      return;
    }
LAB_007ec7f0:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  reader_00 = (char *)((long)&switchD_007ea7cd::switchdataD_010b76e8 +
                      (long)(int)(&switchD_007ea7cd::switchdataD_010b76e8)[uVar18]);
  switch(uVar18) {
  case 0:
    if (layoutSize != SmallLayout) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar17 = 1;
      reader_00 = "layoutSize == SmallLayout";
      data = (OpLayoutEmpty *)0x2e;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypes.h"
                                  ,0x2e,"(layoutSize == SmallLayout)","layoutSize == SmallLayout");
      if (!bVar2) {
LAB_007ec7ee:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar17 = 0;
    }
    ByteCodeReader::Empty(reader);
    DumpEmpty(op,data,dumpFunction,(ByteCodeReader *)reader_00);
    return;
  case 1:
    pOVar7 = ByteCodeReader::Reg1_Small(reader);
    uVar19 = (ulong)pOVar7->R0;
    break;
  case 2:
    pOVar5 = ByteCodeReader::Reg2_Small(reader);
    Output::Print(L" R%d ",(ulong)pOVar5->R0);
    uVar19 = (ulong)pOVar5->R1;
    goto LAB_007ebbd9;
  case 3:
    data_x00145 = ByteCodeReader::ProfiledReg2_Small(reader);
    DumpProfiledReg2<Js::OpLayoutT_Reg2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>
              (op,data_x00145,dumpFunction,reader);
    return;
  case 4:
    data_01 = ByteCodeReader::Reg3_Small(reader);
    DumpReg3<Js::OpLayoutT_Reg3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_01,dumpFunction,reader);
    return;
  case 5:
    data_x00176 = ByteCodeReader::ProfiledReg3_Small(reader);
    DumpProfiledReg3<Js::OpLayoutT_Reg3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>
              (op,data_x00176,dumpFunction,reader);
    return;
  case 6:
    data_00 = ByteCodeReader::Reg3U_Small(reader);
    DumpReg3U<Js::OpLayoutT_Reg3U<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_00,dumpFunction,reader);
    return;
  case 7:
    data_x00148 = ByteCodeReader::Reg4_Small(reader);
    DumpReg4<Js::OpLayoutT_Reg4<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00148,dumpFunction,reader);
    return;
  case 8:
    data_05 = ByteCodeReader::Reg4U_Small(reader);
    DumpReg4U<Js::OpLayoutT_Reg4U<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_05,dumpFunction,reader);
    return;
  case 9:
    data_x00140 = ByteCodeReader::Reg5U_Small(reader);
    DumpReg5U<Js::OpLayoutT_Reg5U<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00140,dumpFunction,reader);
    return;
  case 10:
    data_x00191 = ByteCodeReader::Reg1Unsigned1_Small(reader);
    DumpReg1Unsigned1<Js::OpLayoutT_Reg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00191,dumpFunction,reader);
    return;
  case 0xb:
    data_57 = ByteCodeReader::ProfiledReg1Unsigned1_Small(reader);
    DumpProfiledReg1Unsigned1<Js::OpLayoutT_Reg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>
              (op,data_57,dumpFunction,reader);
    return;
  case 0xc:
    data_66 = ByteCodeReader::Reg2U_Small(reader);
    DumpReg2U<Js::OpLayoutT_Reg2U<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_66,dumpFunction,reader);
    return;
  case 0xd:
    data_x00147 = ByteCodeReader::Reg2B1_Small(reader);
    DumpReg2B1<Js::OpLayoutT_Reg2B1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00147,dumpFunction,reader);
    return;
  case 0xe:
    data_x00117 = ByteCodeReader::Reg3B1_Small(reader);
    DumpReg3B1<Js::OpLayoutT_Reg3B1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00117,dumpFunction,reader);
    return;
  case 0xf:
    data_12 = ByteCodeReader::Reg3C_Small(reader);
    DumpReg3C<Js::OpLayoutT_Reg3C<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_12,dumpFunction,reader);
    return;
  case 0x10:
    data_x00177 = ByteCodeReader::Arg_Small(reader);
    DumpArg<Js::OpLayoutT_Arg<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00177,dumpFunction,reader);
    return;
  case 0x11:
    data_26 = ByteCodeReader::ProfiledArg_Small(reader);
    DumpProfiledArg<Js::OpLayoutT_Arg<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>
              (op,data_26,dumpFunction,reader);
    return;
  case 0x12:
    data_x00124 = ByteCodeReader::ArgNoSrc_Small(reader);
    DumpArgNoSrc<Js::OpLayoutT_ArgNoSrc<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00124,dumpFunction,reader);
    return;
  case 0x13:
    if (layoutSize != SmallLayout) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar17 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypes.h"
                                  ,0x3e,"(layoutSize == SmallLayout)","layoutSize == SmallLayout");
      if (!bVar2) goto LAB_007ec7ee;
      *puVar17 = 0;
    }
    pOVar6 = ByteCodeReader::BrLong(reader);
    uVar18 = pOVar6->RelativeJumpOffset;
    goto LAB_007ec496;
  case 0x14:
    if (layoutSize != SmallLayout) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar17 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypes.h"
                                  ,0x40,"(layoutSize == SmallLayout)","layoutSize == SmallLayout");
      if (!bVar2) goto LAB_007ec7ee;
      *puVar17 = 0;
    }
    pOVar16 = ByteCodeReader::Br(reader);
    uVar18 = (uint)pOVar16->RelativeJumpOffset;
LAB_007ec496:
    uVar4 = ByteCodeReader::GetCurrentOffset(reader);
    Output::Print(L" x:%04x (%4d) ",(ulong)(uVar4 + uVar18),(ulong)uVar18);
    return;
  case 0x15:
    data_x00156 = ByteCodeReader::BrReg1_Small(reader);
    DumpBrReg1<Js::OpLayoutT_BrReg1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00156,dumpFunction,reader);
    return;
  case 0x16:
    data_08 = ByteCodeReader::BrReg2_Small(reader);
    DumpBrReg2<Js::OpLayoutT_BrReg2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_08,dumpFunction,reader);
    return;
  case 0x17:
    data_x00179 = ByteCodeReader::BrReg1Unsigned1_Small(reader);
    DumpBrReg1Unsigned1<Js::OpLayoutT_BrReg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00179,dumpFunction,reader);
    return;
  case 0x18:
    if (layoutSize != SmallLayout) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar17 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypes.h"
                                  ,0x44,"(layoutSize == SmallLayout)","layoutSize == SmallLayout");
      if (!bVar2) goto LAB_007ec7ee;
      *puVar17 = 0;
    }
    data_19 = ByteCodeReader::BrS(reader);
    DumpBrS(EndOfBlock,data_19,dumpFunction_00,reader);
    return;
  case 0x19:
    if (layoutSize != SmallLayout) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar17 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypes.h"
                                  ,0x45,"(layoutSize == SmallLayout)","layoutSize == SmallLayout");
      if (!bVar2) goto LAB_007ec7ee;
      *puVar17 = 0;
    }
    data_x00167 = ByteCodeReader::BrProperty(reader);
    DumpBrProperty(EndOfBlock,data_x00167,dumpFunction,reader);
    return;
  case 0x1a:
    if (layoutSize != SmallLayout) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar17 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypes.h"
                                  ,0x46,"(layoutSize == SmallLayout)","layoutSize == SmallLayout");
      if (!bVar2) goto LAB_007ec7ee;
      *puVar17 = 0;
    }
    data_13 = ByteCodeReader::BrLocalProperty(reader);
    DumpBrLocalProperty(EndOfBlock,data_13,dumpFunction,reader);
    return;
  case 0x1b:
    if (layoutSize != SmallLayout) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar17 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypes.h"
                                  ,0x47,"(layoutSize == SmallLayout)","layoutSize == SmallLayout");
      if (!bVar2) goto LAB_007ec7ee;
      *puVar17 = 0;
    }
    data_33 = ByteCodeReader::BrEnvProperty(reader);
    DumpBrEnvProperty(EndOfBlock,data_33,dumpFunction,reader);
    return;
  case 0x1c:
    if (layoutSize != SmallLayout) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar17 = 1;
      reader_00 = "layoutSize == SmallLayout";
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypes.h"
                                  ,0x48,"(layoutSize == SmallLayout)","layoutSize == SmallLayout");
      if (!bVar2) goto LAB_007ec7ee;
      *puVar17 = 0;
    }
    data_x00184 = ByteCodeReader::StartCall(reader);
    DumpStartCall(op,data_x00184,dumpFunction_01,(ByteCodeReader *)reader_00);
    return;
  case 0x1d:
    data_x00172 = ByteCodeReader::CallI_Small(reader);
    DumpCallI<Js::OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00172,dumpFunction,reader);
    return;
  case 0x1e:
    data_16 = ByteCodeReader::ProfiledCallI_Small(reader);
    DumpProfiledCallI<Js::OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>
              (op,data_16,dumpFunction,reader);
    return;
  case 0x1f:
    data_x00190 = ByteCodeReader::Profiled2CallI_Small(reader);
    DumpProfiled2CallI<Js::OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>
              (op,data_x00190,dumpFunction,reader);
    return;
  case 0x20:
    data_x00166 = ByteCodeReader::CallIFlags_Small(reader);
    DumpCallIFlags<Js::OpLayoutT_CallIFlags<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00166,dumpFunction,reader);
    return;
  case 0x21:
    data_x00137 = ByteCodeReader::ProfiledCallIFlags_Small(reader);
    DumpProfiledCallIFlags<Js::OpLayoutT_CallIFlags<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>
              (op,data_x00137,dumpFunction,reader);
    return;
  case 0x22:
    data_02 = ByteCodeReader::CallIWithICIndex_Small(reader);
    DumpCallIWithICIndex<Js::OpLayoutT_CallIWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_02,dumpFunction,reader);
    return;
  case 0x23:
    data_x00186 = ByteCodeReader::ProfiledCallIWithICIndex_Small(reader);
    DumpProfiledCallIWithICIndex<Js::OpLayoutT_CallIWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>
              (op,data_x00186,dumpFunction,reader);
    return;
  case 0x24:
    data_04 = ByteCodeReader::CallIFlagsWithICIndex_Small(reader);
    DumpCallIFlagsWithICIndex<Js::OpLayoutT_CallIFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_04,dumpFunction,reader);
    return;
  case 0x25:
    data_03 = ByteCodeReader::ProfiledCallIFlagsWithICIndex_Small(reader);
    DumpProfiledCallIFlagsWithICIndex<Js::OpLayoutT_CallIFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>
              (op,data_03,dumpFunction,reader);
    return;
  case 0x26:
    data_x00100 = ByteCodeReader::CallIExtended_Small(reader);
    DumpCallIExtended<Js::OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00100,dumpFunction,reader);
    return;
  case 0x27:
    data_x00127 = ByteCodeReader::ProfiledCallIExtended_Small(reader);
    DumpProfiledCallIExtended<Js::OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>
              (op,data_x00127,dumpFunction,reader);
    return;
  case 0x28:
    data_x00142 = ByteCodeReader::Profiled2CallIExtended_Small(reader);
    DumpProfiled2CallIExtended<Js::OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>
              (op,data_x00142,dumpFunction,reader);
    return;
  case 0x29:
    data_45 = ByteCodeReader::CallIExtendedFlags_Small(reader);
    DumpCallIExtendedFlags<Js::OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_45,dumpFunction,reader);
    return;
  case 0x2a:
    data_15 = ByteCodeReader::ProfiledCallIExtendedFlags_Small(reader);
    DumpProfiledCallIExtendedFlags<Js::OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>
              (op,data_15,dumpFunction,reader);
    return;
  case 0x2b:
    data_x00102 = ByteCodeReader::CallIExtendedWithICIndex_Small(reader);
    DumpCallIExtendedWithICIndex<Js::OpLayoutT_CallIExtendedWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00102,dumpFunction,reader);
    return;
  case 0x2c:
    data_38 = ByteCodeReader::ProfiledCallIExtendedWithICIndex_Small(reader);
    DumpProfiledCallIExtendedWithICIndex<Js::OpLayoutT_CallIExtendedWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>
              (op,data_38,dumpFunction,reader);
    return;
  case 0x2d:
    data_07 = ByteCodeReader::CallIExtendedFlagsWithICIndex_Small(reader);
    DumpCallIExtendedFlagsWithICIndex<Js::OpLayoutT_CallIExtendedFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_07,dumpFunction,reader);
    return;
  case 0x2e:
    data_85 = ByteCodeReader::ProfiledCallIExtendedFlagsWithICIndex_Small(reader);
    DumpProfiledCallIExtendedFlagsWithICIndex<Js::OpLayoutT_CallIExtendedFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>
              (op,data_85,dumpFunction,reader);
    return;
  case 0x2f:
    data_x00185 = ByteCodeReader::ElementI_Small(reader);
    DumpElementI<Js::OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00185,dumpFunction,reader);
    return;
  case 0x30:
    data_x00188 = ByteCodeReader::ProfiledElementI_Small(reader);
    DumpProfiledElementI<Js::OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>
              (op,data_x00188,dumpFunction,reader);
    return;
  case 0x31:
    data_x00183 = ByteCodeReader::ElementUnsigned1_Small(reader);
    DumpElementUnsigned1<Js::OpLayoutT_ElementUnsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00183,dumpFunction,reader);
    return;
  case 0x32:
    data_21 = ByteCodeReader::ElementC_Small(reader);
    DumpElementC<Js::OpLayoutT_ElementC<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_21,dumpFunction,reader);
    return;
  case 0x33:
    data_35 = ByteCodeReader::ElementScopedC_Small(reader);
    DumpElementScopedC<Js::OpLayoutT_ElementScopedC<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_35,dumpFunction,reader);
    return;
  case 0x34:
    data_x00175 = ByteCodeReader::ElementCP_Small(reader);
    DumpElementCP<Js::OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00175,dumpFunction,reader);
    return;
  case 0x35:
    data_x00171 = ByteCodeReader::ProfiledElementCP_Small(reader);
    DumpProfiledElementCP<Js::OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>
              (op,data_x00171,dumpFunction,reader);
    return;
  case 0x36:
    data_06 = ByteCodeReader::ElementP_Small(reader);
    DumpElementP<Js::OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_06,dumpFunction,reader);
    return;
  case 0x37:
    data_x00189 = ByteCodeReader::ElementPIndexed_Small(reader);
    DumpElementPIndexed<Js::OpLayoutT_ElementPIndexed<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00189,dumpFunction,reader);
    return;
  case 0x38:
    data_77 = ByteCodeReader::ElementRootCP_Small(reader);
    DumpElementRootCP<Js::OpLayoutT_ElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_77,dumpFunction,reader);
    return;
  case 0x39:
    data_10 = ByteCodeReader::ElementC2_Small(reader);
    DumpElementC2<Js::OpLayoutT_ElementC2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_10,dumpFunction,reader);
    return;
  case 0x3a:
    data_x00181 = ByteCodeReader::ElementScopedC2_Small(reader);
    DumpElementScopedC2<Js::OpLayoutT_ElementScopedC2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00181,dumpFunction,reader);
    return;
  case 0x3b:
    data_x00150 = ByteCodeReader::ElementSlot_Small(reader);
    DumpElementSlot<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00150,dumpFunction,reader);
    return;
  case 0x3c:
    data_x00182 = ByteCodeReader::ProfiledElementSlot_Small(reader);
    DumpProfiledElementSlot<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>
              (op,data_x00182,dumpFunction,reader);
    return;
  case 0x3d:
    data_x00163 = ByteCodeReader::ElementSlotI1_Small(reader);
    DumpElementSlotI1<Js::OpLayoutT_ElementSlotI1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00163,dumpFunction,reader);
    return;
  case 0x3e:
    data_x00187 = ByteCodeReader::ProfiledElementSlotI1_Small(reader);
    DumpProfiledElementSlotI1<Js::OpLayoutT_ElementSlotI1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>
              (op,data_x00187,dumpFunction,reader);
    return;
  case 0x3f:
    data_27 = ByteCodeReader::ElementSlotI2_Small(reader);
    DumpElementSlotI2<Js::OpLayoutT_ElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_27,dumpFunction,reader);
    return;
  case 0x40:
    data_09 = ByteCodeReader::ProfiledElementSlotI2_Small(reader);
    DumpProfiledElementSlotI2<Js::OpLayoutT_ElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>
              (op,data_09,dumpFunction,reader);
    return;
  case 0x41:
    data_40 = ByteCodeReader::ElementSlotI3_Small(reader);
    DumpElementSlotI3<Js::OpLayoutT_ElementSlotI3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_40,dumpFunction,reader);
    return;
  case 0x42:
    data_17 = ByteCodeReader::ProfiledElementSlotI3_Small(reader);
    DumpProfiledElementSlotI3<Js::OpLayoutT_ElementSlotI3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>
              (op,data_17,dumpFunction,reader);
    return;
  case 0x43:
    data_49 = ByteCodeReader::ElementU_Small(reader);
    DumpElementU<Js::OpLayoutT_ElementU<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_49,dumpFunction,reader);
    return;
  case 0x44:
    data_x00151 = ByteCodeReader::ElementScopedU_Small(reader);
    DumpElementScopedU<Js::OpLayoutT_ElementScopedU<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00151,dumpFunction,reader);
    return;
  case 0x45:
    data_99 = ByteCodeReader::ElementRootU_Small(reader);
    DumpElementRootU<Js::OpLayoutT_ElementRootU<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_99,dumpFunction,reader);
    return;
  case 0x46:
    if (layoutSize != SmallLayout) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar17 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypes.h"
                                  ,0x62,"(layoutSize == SmallLayout)","layoutSize == SmallLayout");
      if (!bVar2) goto LAB_007ec7f0;
      *puVar17 = 0;
    }
    pOVar14 = ByteCodeReader::W1(reader);
    uVar19 = (ulong)pOVar14->C1;
    form = L" ushort:%d ";
    goto LAB_007ec082;
  case 0x47:
    data_60 = ByteCodeReader::Reg2Int1_Small(reader);
    DumpReg2Int1<Js::OpLayoutT_Reg2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_60,dumpFunction,reader);
    return;
  case 0x48:
    if (layoutSize != SmallLayout) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar17 = 1;
      reader_00 = "layoutSize == SmallLayout";
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypes.h"
                                  ,100,"(layoutSize == SmallLayout)","layoutSize == SmallLayout");
      if (!bVar2) goto LAB_007ec7f0;
      *puVar17 = 0;
    }
    playout_01 = ByteCodeReader::AuxNoReg(reader);
    DumpAuxNoReg(op,playout_01,dumpFunction,(ByteCodeReader *)reader_00);
    return;
  case 0x49:
    if (layoutSize != SmallLayout) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar17 = 1;
      reader_00 = "layoutSize == SmallLayout";
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypes.h"
                                  ,0x65,"(layoutSize == SmallLayout)","layoutSize == SmallLayout");
      if (!bVar2) goto LAB_007ec7f0;
      *puVar17 = 0;
    }
    playout = ByteCodeReader::Auxiliary(reader);
    DumpAuxiliary(op,playout,dumpFunction,(ByteCodeReader *)reader_00);
    return;
  case 0x4a:
    if (layoutSize != SmallLayout) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar17 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypes.h"
                                  ,0x65,"(layoutSize == SmallLayout)","layoutSize == SmallLayout");
      if (!bVar2) goto LAB_007ec7f0;
      *puVar17 = 0;
    }
    data_x00158 = ByteCodeReader::ProfiledAuxiliary(reader);
    DumpProfiledAuxiliary(op,data_x00158,dumpFunction,reader);
    return;
  case 0x4b:
    if (layoutSize != SmallLayout) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar17 = 1;
      reader_00 = "layoutSize == SmallLayout";
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypes.h"
                                  ,0x66,"(layoutSize == SmallLayout)","layoutSize == SmallLayout");
      if (!bVar2) goto LAB_007ec7f0;
      *puVar17 = 0;
    }
    playout_00 = ByteCodeReader::Reg2Aux(reader);
    DumpReg2Aux(op,playout_00,dumpFunction,(ByteCodeReader *)reader_00);
    return;
  case 0x4c:
    data_30 = ByteCodeReader::Reg5_Small(reader);
    DumpReg5<Js::OpLayoutT_Reg5<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_30,dumpFunction,reader);
    return;
  case 0x4d:
    pOVar15 = ByteCodeReader::Unsigned1_Small(reader);
    uVar19 = (ulong)pOVar15->C1;
    goto LAB_007ec07b;
  default:
    goto switchD_007ea7cd_caseD_4e;
  case 0x4f:
    pOVar8 = ByteCodeReader::Reg1_Medium(reader);
    uVar19 = (ulong)pOVar8->R0;
    break;
  case 0x50:
    pOVar13 = ByteCodeReader::Reg2_Medium(reader);
    Output::Print(L" R%d ",(ulong)pOVar13->R0);
    uVar19 = (ulong)pOVar13->R1;
    goto LAB_007ebbd9;
  case 0x51:
    data_82 = ByteCodeReader::ProfiledReg2_Medium(reader);
    DumpProfiledReg2<Js::OpLayoutT_Reg2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>
              (op,data_82,dumpFunction,reader);
    return;
  case 0x52:
    data_x00119 = ByteCodeReader::Reg3_Medium(reader);
    DumpReg3<Js::OpLayoutT_Reg3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00119,dumpFunction,reader);
    return;
  case 0x53:
    data_91 = ByteCodeReader::ProfiledReg3_Medium(reader);
    DumpProfiledReg3<Js::OpLayoutT_Reg3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>
              (op,data_91,dumpFunction,reader);
    return;
  case 0x54:
    data_x00152 = ByteCodeReader::Reg3U_Medium(reader);
    DumpReg3U<Js::OpLayoutT_Reg3U<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00152,dumpFunction,reader);
    return;
  case 0x55:
    data_11 = ByteCodeReader::Reg4_Medium(reader);
    DumpReg4<Js::OpLayoutT_Reg4<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_11,dumpFunction,reader);
    return;
  case 0x56:
    data_18 = ByteCodeReader::Reg4U_Medium(reader);
    DumpReg4U<Js::OpLayoutT_Reg4U<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_18,dumpFunction,reader);
    return;
  case 0x57:
    data_76 = ByteCodeReader::Reg5U_Medium(reader);
    DumpReg5U<Js::OpLayoutT_Reg5U<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_76,dumpFunction,reader);
    return;
  case 0x58:
    data_29 = ByteCodeReader::Reg1Unsigned1_Medium(reader);
    DumpReg1Unsigned1<Js::OpLayoutT_Reg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_29,dumpFunction,reader);
    return;
  case 0x59:
    data_x00125 = ByteCodeReader::ProfiledReg1Unsigned1_Medium(reader);
    DumpProfiledReg1Unsigned1<Js::OpLayoutT_Reg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>
              (op,data_x00125,dumpFunction,reader);
    return;
  case 0x5a:
    data_x00128 = ByteCodeReader::Reg2U_Medium(reader);
    DumpReg2U<Js::OpLayoutT_Reg2U<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00128,dumpFunction,reader);
    return;
  case 0x5b:
    data_72 = ByteCodeReader::Reg2B1_Medium(reader);
    DumpReg2B1<Js::OpLayoutT_Reg2B1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_72,dumpFunction,reader);
    return;
  case 0x5c:
    data_x00138 = ByteCodeReader::Reg3B1_Medium(reader);
    DumpReg3B1<Js::OpLayoutT_Reg3B1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00138,dumpFunction,reader);
    return;
  case 0x5d:
    data_x00123 = ByteCodeReader::Reg3C_Medium(reader);
    DumpReg3C<Js::OpLayoutT_Reg3C<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00123,dumpFunction,reader);
    return;
  case 0x5e:
    data_44 = ByteCodeReader::Arg_Medium(reader);
    DumpArg<Js::OpLayoutT_Arg<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_44,dumpFunction,reader);
    return;
  case 0x5f:
    data_47 = ByteCodeReader::ProfiledArg_Medium(reader);
    DumpProfiledArg<Js::OpLayoutT_Arg<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>
              (op,data_47,dumpFunction,reader);
    return;
  case 0x60:
    data_x00126 = ByteCodeReader::ArgNoSrc_Medium(reader);
    DumpArgNoSrc<Js::OpLayoutT_ArgNoSrc<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00126,dumpFunction,reader);
    return;
  case 99:
    data_x00144 = ByteCodeReader::BrReg1_Medium(reader);
    DumpBrReg1<Js::OpLayoutT_BrReg1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00144,dumpFunction,reader);
    return;
  case 100:
    data_14 = ByteCodeReader::BrReg2_Medium(reader);
    DumpBrReg2<Js::OpLayoutT_BrReg2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_14,dumpFunction,reader);
    return;
  case 0x65:
    data_22 = ByteCodeReader::BrReg1Unsigned1_Medium(reader);
    DumpBrReg1Unsigned1<Js::OpLayoutT_BrReg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_22,dumpFunction,reader);
    return;
  case 0x6b:
    data_46 = ByteCodeReader::CallI_Medium(reader);
    DumpCallI<Js::OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_46,dumpFunction,reader);
    return;
  case 0x6c:
    data_54 = ByteCodeReader::ProfiledCallI_Medium(reader);
    DumpProfiledCallI<Js::OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>
              (op,data_54,dumpFunction,reader);
    return;
  case 0x6d:
    data_25 = ByteCodeReader::Profiled2CallI_Medium(reader);
    DumpProfiled2CallI<Js::OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>
              (op,data_25,dumpFunction,reader);
    return;
  case 0x6e:
    data_32 = ByteCodeReader::CallIFlags_Medium(reader);
    DumpCallIFlags<Js::OpLayoutT_CallIFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_32,dumpFunction,reader);
    return;
  case 0x6f:
    data_x00160 = ByteCodeReader::ProfiledCallIFlags_Medium(reader);
    DumpProfiledCallIFlags<Js::OpLayoutT_CallIFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>
              (op,data_x00160,dumpFunction,reader);
    return;
  case 0x70:
    data_x00162 = ByteCodeReader::CallIWithICIndex_Medium(reader);
    DumpCallIWithICIndex<Js::OpLayoutT_CallIWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00162,dumpFunction,reader);
    return;
  case 0x71:
    data_43 = ByteCodeReader::ProfiledCallIWithICIndex_Medium(reader);
    DumpProfiledCallIWithICIndex<Js::OpLayoutT_CallIWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>
              (op,data_43,dumpFunction,reader);
    return;
  case 0x72:
    data_x00165 = ByteCodeReader::CallIFlagsWithICIndex_Medium(reader);
    DumpCallIFlagsWithICIndex<Js::OpLayoutT_CallIFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00165,dumpFunction,reader);
    return;
  case 0x73:
    data_x00170 = ByteCodeReader::ProfiledCallIFlagsWithICIndex_Medium(reader);
    DumpProfiledCallIFlagsWithICIndex<Js::OpLayoutT_CallIFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>
              (op,data_x00170,dumpFunction,reader);
    return;
  case 0x74:
    data_x00180 = ByteCodeReader::CallIExtended_Medium(reader);
    DumpCallIExtended<Js::OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00180,dumpFunction,reader);
    return;
  case 0x75:
    data_96 = ByteCodeReader::ProfiledCallIExtended_Medium(reader);
    DumpProfiledCallIExtended<Js::OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>
              (op,data_96,dumpFunction,reader);
    return;
  case 0x76:
    data_x00178 = ByteCodeReader::Profiled2CallIExtended_Medium(reader);
    DumpProfiled2CallIExtended<Js::OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>
              (op,data_x00178,dumpFunction,reader);
    return;
  case 0x77:
    data_31 = ByteCodeReader::CallIExtendedFlags_Medium(reader);
    DumpCallIExtendedFlags<Js::OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_31,dumpFunction,reader);
    return;
  case 0x78:
    data_x00169 = ByteCodeReader::ProfiledCallIExtendedFlags_Medium(reader);
    DumpProfiledCallIExtendedFlags<Js::OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>
              (op,data_x00169,dumpFunction,reader);
    return;
  case 0x79:
    data_x00101 = ByteCodeReader::CallIExtendedWithICIndex_Medium(reader);
    DumpCallIExtendedWithICIndex<Js::OpLayoutT_CallIExtendedWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00101,dumpFunction,reader);
    return;
  case 0x7a:
    data_37 = ByteCodeReader::ProfiledCallIExtendedWithICIndex_Medium(reader);
    DumpProfiledCallIExtendedWithICIndex<Js::OpLayoutT_CallIExtendedWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>
              (op,data_37,dumpFunction,reader);
    return;
  case 0x7b:
    data_95 = ByteCodeReader::CallIExtendedFlagsWithICIndex_Medium(reader);
    DumpCallIExtendedFlagsWithICIndex<Js::OpLayoutT_CallIExtendedFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_95,dumpFunction,reader);
    return;
  case 0x7c:
    data_24 = ByteCodeReader::ProfiledCallIExtendedFlagsWithICIndex_Medium(reader);
    DumpProfiledCallIExtendedFlagsWithICIndex<Js::OpLayoutT_CallIExtendedFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>
              (op,data_24,dumpFunction,reader);
    return;
  case 0x7d:
    data_x00173 = ByteCodeReader::ElementI_Medium(reader);
    DumpElementI<Js::OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00173,dumpFunction,reader);
    return;
  case 0x7e:
    data_x00174 = ByteCodeReader::ProfiledElementI_Medium(reader);
    DumpProfiledElementI<Js::OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>
              (op,data_x00174,dumpFunction,reader);
    return;
  case 0x7f:
    data_41 = ByteCodeReader::ElementUnsigned1_Medium(reader);
    DumpElementUnsigned1<Js::OpLayoutT_ElementUnsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_41,dumpFunction,reader);
    return;
  case 0x80:
    data_x00157 = ByteCodeReader::ElementC_Medium(reader);
    DumpElementC<Js::OpLayoutT_ElementC<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00157,dumpFunction,reader);
    return;
  case 0x81:
    data_x00122 = ByteCodeReader::ElementScopedC_Medium(reader);
    DumpElementScopedC<Js::OpLayoutT_ElementScopedC<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00122,dumpFunction,reader);
    return;
  case 0x82:
    data_x00120 = ByteCodeReader::ElementCP_Medium(reader);
    DumpElementCP<Js::OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00120,dumpFunction,reader);
    return;
  case 0x83:
    data_20 = ByteCodeReader::ProfiledElementCP_Medium(reader);
    DumpProfiledElementCP<Js::OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>
              (op,data_20,dumpFunction,reader);
    return;
  case 0x84:
    data_23 = ByteCodeReader::ElementP_Medium(reader);
    DumpElementP<Js::OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_23,dumpFunction,reader);
    return;
  case 0x85:
    data_74 = ByteCodeReader::ElementPIndexed_Medium(reader);
    DumpElementPIndexed<Js::OpLayoutT_ElementPIndexed<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_74,dumpFunction,reader);
    return;
  case 0x86:
    data_78 = ByteCodeReader::ElementRootCP_Medium(reader);
    DumpElementRootCP<Js::OpLayoutT_ElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_78,dumpFunction,reader);
    return;
  case 0x87:
    data_50 = ByteCodeReader::ElementC2_Medium(reader);
    DumpElementC2<Js::OpLayoutT_ElementC2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_50,dumpFunction,reader);
    return;
  case 0x88:
    data_28 = ByteCodeReader::ElementScopedC2_Medium(reader);
    DumpElementScopedC2<Js::OpLayoutT_ElementScopedC2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_28,dumpFunction,reader);
    return;
  case 0x89:
    data_x00164 = ByteCodeReader::ElementSlot_Medium(reader);
    DumpElementSlot<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00164,dumpFunction,reader);
    return;
  case 0x8a:
    data_36 = ByteCodeReader::ProfiledElementSlot_Medium(reader);
    DumpProfiledElementSlot<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>
              (op,data_36,dumpFunction,reader);
    return;
  case 0x8b:
    data_x00104 = ByteCodeReader::ElementSlotI1_Medium(reader);
    DumpElementSlotI1<Js::OpLayoutT_ElementSlotI1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00104,dumpFunction,reader);
    return;
  case 0x8c:
    data_58 = ByteCodeReader::ProfiledElementSlotI1_Medium(reader);
    DumpProfiledElementSlotI1<Js::OpLayoutT_ElementSlotI1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>
              (op,data_58,dumpFunction,reader);
    return;
  case 0x8d:
    data_x00159 = ByteCodeReader::ElementSlotI2_Medium(reader);
    DumpElementSlotI2<Js::OpLayoutT_ElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00159,dumpFunction,reader);
    return;
  case 0x8e:
    data_x00155 = ByteCodeReader::ProfiledElementSlotI2_Medium(reader);
    DumpProfiledElementSlotI2<Js::OpLayoutT_ElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>
              (op,data_x00155,dumpFunction,reader);
    return;
  case 0x8f:
    data_x00146 = ByteCodeReader::ElementSlotI3_Medium(reader);
    DumpElementSlotI3<Js::OpLayoutT_ElementSlotI3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00146,dumpFunction,reader);
    return;
  case 0x90:
    data_51 = ByteCodeReader::ProfiledElementSlotI3_Medium(reader);
    DumpProfiledElementSlotI3<Js::OpLayoutT_ElementSlotI3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>
              (op,data_51,dumpFunction,reader);
    return;
  case 0x91:
    data_34 = ByteCodeReader::ElementU_Medium(reader);
    DumpElementU<Js::OpLayoutT_ElementU<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_34,dumpFunction,reader);
    return;
  case 0x92:
    data_62 = ByteCodeReader::ElementScopedU_Medium(reader);
    DumpElementScopedU<Js::OpLayoutT_ElementScopedU<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_62,dumpFunction,reader);
    return;
  case 0x93:
    data_x00168 = ByteCodeReader::ElementRootU_Medium(reader);
    DumpElementRootU<Js::OpLayoutT_ElementRootU<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00168,dumpFunction,reader);
    return;
  case 0x95:
    data_67 = ByteCodeReader::Reg2Int1_Medium(reader);
    DumpReg2Int1<Js::OpLayoutT_Reg2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_67,dumpFunction,reader);
    return;
  case 0x9a:
    data_48 = ByteCodeReader::Reg5_Medium(reader);
    DumpReg5<Js::OpLayoutT_Reg5<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_48,dumpFunction,reader);
    return;
  case 0x9b:
    pOVar12 = ByteCodeReader::Unsigned1_Medium(reader);
    uVar19 = (ulong)pOVar12->C1;
    goto LAB_007ec07b;
  case 0x9d:
    pOVar9 = ByteCodeReader::Reg1_Large(reader);
    uVar19 = (ulong)pOVar9->R0;
    break;
  case 0x9e:
    pOVar10 = ByteCodeReader::Reg2_Large(reader);
    Output::Print(L" R%d ",(ulong)pOVar10->R0);
    uVar19 = (ulong)pOVar10->R1;
LAB_007ebbd9:
    form = L" R%d ";
    goto LAB_007ec082;
  case 0x9f:
    data_x00108 = ByteCodeReader::ProfiledReg2_Large(reader);
    DumpProfiledReg2<Js::OpLayoutT_Reg2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
              (op,data_x00108,dumpFunction,reader);
    return;
  case 0xa0:
    data_x00106 = ByteCodeReader::Reg3_Large(reader);
    DumpReg3<Js::OpLayoutT_Reg3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00106,dumpFunction,reader);
    return;
  case 0xa1:
    data_83 = ByteCodeReader::ProfiledReg3_Large(reader);
    DumpProfiledReg3<Js::OpLayoutT_Reg3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
              (op,data_83,dumpFunction,reader);
    return;
  case 0xa2:
    data_x00133 = ByteCodeReader::Reg3U_Large(reader);
    DumpReg3U<Js::OpLayoutT_Reg3U<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00133,dumpFunction,reader);
    return;
  case 0xa3:
    data_73 = ByteCodeReader::Reg4_Large(reader);
    DumpReg4<Js::OpLayoutT_Reg4<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_73,dumpFunction,reader);
    return;
  case 0xa4:
    data_x00131 = ByteCodeReader::Reg4U_Large(reader);
    DumpReg4U<Js::OpLayoutT_Reg4U<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00131,dumpFunction,reader);
    return;
  case 0xa5:
    data_56 = ByteCodeReader::Reg5U_Large(reader);
    DumpReg5U<Js::OpLayoutT_Reg5U<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_56,dumpFunction,reader);
    return;
  case 0xa6:
    data_x00149 = ByteCodeReader::Reg1Unsigned1_Large(reader);
    DumpReg1Unsigned1<Js::OpLayoutT_Reg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00149,dumpFunction,reader);
    return;
  case 0xa7:
    data_x00143 = ByteCodeReader::ProfiledReg1Unsigned1_Large(reader);
    DumpProfiledReg1Unsigned1<Js::OpLayoutT_Reg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
              (op,data_x00143,dumpFunction,reader);
    return;
  case 0xa8:
    data_53 = ByteCodeReader::Reg2U_Large(reader);
    DumpReg2U<Js::OpLayoutT_Reg2U<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_53,dumpFunction,reader);
    return;
  case 0xa9:
    data_x00153 = ByteCodeReader::Reg2B1_Large(reader);
    DumpReg2B1<Js::OpLayoutT_Reg2B1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00153,dumpFunction,reader);
    return;
  case 0xaa:
    data_x00161 = ByteCodeReader::Reg3B1_Large(reader);
    DumpReg3B1<Js::OpLayoutT_Reg3B1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00161,dumpFunction,reader);
    return;
  case 0xab:
    data_39 = ByteCodeReader::Reg3C_Large(reader);
    DumpReg3C<Js::OpLayoutT_Reg3C<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_39,dumpFunction,reader);
    return;
  case 0xac:
    data_79 = ByteCodeReader::Arg_Large(reader);
    DumpArg<Js::OpLayoutT_Arg<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_79,dumpFunction,reader);
    return;
  case 0xad:
    data_71 = ByteCodeReader::ProfiledArg_Large(reader);
    DumpProfiledArg<Js::OpLayoutT_Arg<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
              (op,data_71,dumpFunction,reader);
    return;
  case 0xae:
    data_55 = ByteCodeReader::ArgNoSrc_Large(reader);
    DumpArgNoSrc<Js::OpLayoutT_ArgNoSrc<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_55,dumpFunction,reader);
    return;
  case 0xb1:
    data_x00154 = ByteCodeReader::BrReg1_Large(reader);
    DumpBrReg1<Js::OpLayoutT_BrReg1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00154,dumpFunction,reader);
    return;
  case 0xb2:
    data_x00118 = ByteCodeReader::BrReg2_Large(reader);
    DumpBrReg2<Js::OpLayoutT_BrReg2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00118,dumpFunction,reader);
    return;
  case 0xb3:
    data_68 = ByteCodeReader::BrReg1Unsigned1_Large(reader);
    DumpBrReg1Unsigned1<Js::OpLayoutT_BrReg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_68,dumpFunction,reader);
    return;
  case 0xb9:
    data_42 = ByteCodeReader::CallI_Large(reader);
    DumpCallI<Js::OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_42,dumpFunction,reader);
    return;
  case 0xba:
    data_x00132 = ByteCodeReader::ProfiledCallI_Large(reader);
    DumpProfiledCallI<Js::OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
              (op,data_x00132,dumpFunction,reader);
    return;
  case 0xbb:
    data_x00103 = ByteCodeReader::Profiled2CallI_Large(reader);
    DumpProfiled2CallI<Js::OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
              (op,data_x00103,dumpFunction,reader);
    return;
  case 0xbc:
    data_81 = ByteCodeReader::CallIFlags_Large(reader);
    DumpCallIFlags<Js::OpLayoutT_CallIFlags<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_81,dumpFunction,reader);
    return;
  case 0xbd:
    data_x00129 = ByteCodeReader::ProfiledCallIFlags_Large(reader);
    DumpProfiledCallIFlags<Js::OpLayoutT_CallIFlags<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
              (op,data_x00129,dumpFunction,reader);
    return;
  case 0xbe:
    data_x00139 = ByteCodeReader::CallIWithICIndex_Large(reader);
    DumpCallIWithICIndex<Js::OpLayoutT_CallIWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00139,dumpFunction,reader);
    return;
  case 0xbf:
    data_52 = ByteCodeReader::ProfiledCallIWithICIndex_Large(reader);
    DumpProfiledCallIWithICIndex<Js::OpLayoutT_CallIWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
              (op,data_52,dumpFunction,reader);
    return;
  case 0xc0:
    data_61 = ByteCodeReader::CallIFlagsWithICIndex_Large(reader);
    DumpCallIFlagsWithICIndex<Js::OpLayoutT_CallIFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_61,dumpFunction,reader);
    return;
  case 0xc1:
    data_59 = ByteCodeReader::ProfiledCallIFlagsWithICIndex_Large(reader);
    DumpProfiledCallIFlagsWithICIndex<Js::OpLayoutT_CallIFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
              (op,data_59,dumpFunction,reader);
    return;
  case 0xc2:
    data_64 = ByteCodeReader::CallIExtended_Large(reader);
    DumpCallIExtended<Js::OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_64,dumpFunction,reader);
    return;
  case 0xc3:
    data_70 = ByteCodeReader::ProfiledCallIExtended_Large(reader);
    DumpProfiledCallIExtended<Js::OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
              (op,data_70,dumpFunction,reader);
    return;
  case 0xc4:
    data_x00116 = ByteCodeReader::Profiled2CallIExtended_Large(reader);
    DumpProfiled2CallIExtended<Js::OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
              (op,data_x00116,dumpFunction,reader);
    return;
  case 0xc5:
    data_97 = ByteCodeReader::CallIExtendedFlags_Large(reader);
    DumpCallIExtendedFlags<Js::OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_97,dumpFunction,reader);
    return;
  case 0xc6:
    data_x00115 = ByteCodeReader::ProfiledCallIExtendedFlags_Large(reader);
    DumpProfiledCallIExtendedFlags<Js::OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
              (op,data_x00115,dumpFunction,reader);
    return;
  case 199:
    data_x00136 = ByteCodeReader::CallIExtendedWithICIndex_Large(reader);
    DumpCallIExtendedWithICIndex<Js::OpLayoutT_CallIExtendedWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00136,dumpFunction,reader);
    return;
  case 200:
    data_x00135 = ByteCodeReader::ProfiledCallIExtendedWithICIndex_Large(reader);
    DumpProfiledCallIExtendedWithICIndex<Js::OpLayoutT_CallIExtendedWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
              (op,data_x00135,dumpFunction,reader);
    return;
  case 0xc9:
    data_63 = ByteCodeReader::CallIExtendedFlagsWithICIndex_Large(reader);
    DumpCallIExtendedFlagsWithICIndex<Js::OpLayoutT_CallIExtendedFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_63,dumpFunction,reader);
    return;
  case 0xca:
    data_x00141 = ByteCodeReader::ProfiledCallIExtendedFlagsWithICIndex_Large(reader);
    DumpProfiledCallIExtendedFlagsWithICIndex<Js::OpLayoutT_CallIExtendedFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
              (op,data_x00141,dumpFunction,reader);
    return;
  case 0xcb:
    data_87 = ByteCodeReader::ElementI_Large(reader);
    DumpElementI<Js::OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_87,dumpFunction,reader);
    return;
  case 0xcc:
    data_88 = ByteCodeReader::ProfiledElementI_Large(reader);
    DumpProfiledElementI<Js::OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
              (op,data_88,dumpFunction,reader);
    return;
  case 0xcd:
    data_x00134 = ByteCodeReader::ElementUnsigned1_Large(reader);
    DumpElementUnsigned1<Js::OpLayoutT_ElementUnsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00134,dumpFunction,reader);
    return;
  case 0xce:
    data_x00121 = ByteCodeReader::ElementC_Large(reader);
    DumpElementC<Js::OpLayoutT_ElementC<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00121,dumpFunction,reader);
    return;
  case 0xcf:
    data_x00109 = ByteCodeReader::ElementScopedC_Large(reader);
    DumpElementScopedC<Js::OpLayoutT_ElementScopedC<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00109,dumpFunction,reader);
    return;
  case 0xd0:
    data_x00105 = ByteCodeReader::ElementCP_Large(reader);
    DumpElementCP<Js::OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00105,dumpFunction,reader);
    return;
  case 0xd1:
    data_x00130 = ByteCodeReader::ProfiledElementCP_Large(reader);
    DumpProfiledElementCP<Js::OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
              (op,data_x00130,dumpFunction,reader);
    return;
  case 0xd2:
    data_x00112 = ByteCodeReader::ElementP_Large(reader);
    DumpElementP<Js::OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00112,dumpFunction,reader);
    return;
  case 0xd3:
    data_98 = ByteCodeReader::ElementPIndexed_Large(reader);
    DumpElementPIndexed<Js::OpLayoutT_ElementPIndexed<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_98,dumpFunction,reader);
    return;
  case 0xd4:
    data_65 = ByteCodeReader::ElementRootCP_Large(reader);
    DumpElementRootCP<Js::OpLayoutT_ElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_65,dumpFunction,reader);
    return;
  case 0xd5:
    data_90 = ByteCodeReader::ElementC2_Large(reader);
    DumpElementC2<Js::OpLayoutT_ElementC2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_90,dumpFunction,reader);
    return;
  case 0xd6:
    data_69 = ByteCodeReader::ElementScopedC2_Large(reader);
    DumpElementScopedC2<Js::OpLayoutT_ElementScopedC2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_69,dumpFunction,reader);
    return;
  case 0xd7:
    data_x00110 = ByteCodeReader::ElementSlot_Large(reader);
    DumpElementSlot<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00110,dumpFunction,reader);
    return;
  case 0xd8:
    data_84 = ByteCodeReader::ProfiledElementSlot_Large(reader);
    DumpProfiledElementSlot<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
              (op,data_84,dumpFunction,reader);
    return;
  case 0xd9:
    data_75 = ByteCodeReader::ElementSlotI1_Large(reader);
    DumpElementSlotI1<Js::OpLayoutT_ElementSlotI1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_75,dumpFunction,reader);
    return;
  case 0xda:
    data_x00113 = ByteCodeReader::ProfiledElementSlotI1_Large(reader);
    DumpProfiledElementSlotI1<Js::OpLayoutT_ElementSlotI1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
              (op,data_x00113,dumpFunction,reader);
    return;
  case 0xdb:
    data_86 = ByteCodeReader::ElementSlotI2_Large(reader);
    DumpElementSlotI2<Js::OpLayoutT_ElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_86,dumpFunction,reader);
    return;
  case 0xdc:
    data_x00114 = ByteCodeReader::ProfiledElementSlotI2_Large(reader);
    DumpProfiledElementSlotI2<Js::OpLayoutT_ElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
              (op,data_x00114,dumpFunction,reader);
    return;
  case 0xdd:
    data_93 = ByteCodeReader::ElementSlotI3_Large(reader);
    DumpElementSlotI3<Js::OpLayoutT_ElementSlotI3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_93,dumpFunction,reader);
    return;
  case 0xde:
    data_x00111 = ByteCodeReader::ProfiledElementSlotI3_Large(reader);
    DumpProfiledElementSlotI3<Js::OpLayoutT_ElementSlotI3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
              (op,data_x00111,dumpFunction,reader);
    return;
  case 0xdf:
    data_x00107 = ByteCodeReader::ElementU_Large(reader);
    DumpElementU<Js::OpLayoutT_ElementU<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00107,dumpFunction,reader);
    return;
  case 0xe0:
    data_80 = ByteCodeReader::ElementScopedU_Large(reader);
    DumpElementScopedU<Js::OpLayoutT_ElementScopedU<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_80,dumpFunction,reader);
    return;
  case 0xe1:
    data_92 = ByteCodeReader::ElementRootU_Large(reader);
    DumpElementRootU<Js::OpLayoutT_ElementRootU<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_92,dumpFunction,reader);
    return;
  case 0xe3:
    data_89 = ByteCodeReader::Reg2Int1_Large(reader);
    DumpReg2Int1<Js::OpLayoutT_Reg2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_89,dumpFunction,reader);
    return;
  case 0xe8:
    data_94 = ByteCodeReader::Reg5_Large(reader);
    DumpReg5<Js::OpLayoutT_Reg5<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_94,dumpFunction,reader);
    return;
  case 0xe9:
    pOVar11 = ByteCodeReader::Unsigned1_Large(reader);
    uVar19 = (ulong)pOVar11->C1;
LAB_007ec07b:
    form = L" uint:%u ";
    goto LAB_007ec082;
  }
  form = L" R%d ";
LAB_007ec082:
  Output::Print(form,uVar19);
  return;
}

Assistant:

void ByteCodeDumper::DumpOp(OpCode op, LayoutSize layoutSize, ByteCodeReader& reader, FunctionBody* dumpFunction)
    {
        Output::Print(_u("%-20s"), OpCodeUtil::GetOpCodeName(op));
        OpLayoutType nType = OpCodeUtil::GetOpCodeLayout(op);
        switch (layoutSize * OpLayoutType::Count + nType)
        {
#define LAYOUT_TYPE(layout) \
            case OpLayoutType::layout: \
                Assert(layoutSize == SmallLayout); \
                Dump##layout(op, reader.layout(), dumpFunction, reader); \
                break;

#define LAYOUT_SCHEMA(type, layout) \
            case type##Layout * OpLayoutType::Count + OpLayoutType::layout: \
                Dump##layout(op, reader.layout##_##type(), dumpFunction, reader); \
                break

#define LAYOUT_TYPE_WMS(layout) \
            LAYOUT_SCHEMA(Small,  layout); \
            LAYOUT_SCHEMA(Medium, layout); \
            LAYOUT_SCHEMA(Large,  layout);

#define LAYOUT_TYPE_PROFILED_WMS(layout) \
            LAYOUT_TYPE_WMS(Profiled##layout) \
            LAYOUT_TYPE_WMS(layout)

#include "LayoutTypes.h"

            default:
            {
                AssertMsg(false, "Unknown OpLayout");
                break;
            }
        }
    }